

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O1

void lts2::InverseWaveletTransform2D
               (Mat *src,Mat *dest,double *P,double *Q,int fsize,int *ww,int *wh)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int n;
  int n_00;
  vector<cv::Mat,_std::allocator<cv::Mat>_> components;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_98;
  double *local_80;
  double *local_78;
  Mat *local_70;
  int local_68;
  int local_64;
  _OutputArray local_60;
  _InputArray local_48;
  
  local_80 = P;
  local_78 = Q;
  if (*(long *)(src + 0x10) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"InverseWaveletTransform2D() src == NULL",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    return;
  }
  iVar1 = **(int **)(src + 0x40);
  iVar2 = (*(int **)(src + 0x40))[1];
  local_68 = iVar2;
  local_64 = iVar1;
  cv::Mat::create(dest,&local_68,*(uint *)src & 0xfff);
  local_60.super__InputArray.obj = &local_98;
  local_98.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.sz.width = 0;
  local_48.sz.height = 0;
  local_48.flags = 0x1010000;
  local_60.super__InputArray.sz.width = 0;
  local_60.super__InputArray.sz.height = 0;
  local_60.super__InputArray.flags = 0x2050000;
  local_48.obj = src;
  cv::split(&local_48,&local_60);
  n = *ww;
  n_00 = *wh;
  if (n_00 != 0 && n != 0) {
    local_70 = dest;
    if (n_00 <= iVar1 && n <= iVar2) {
      do {
        if (local_98.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_98.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar5 = 0;
          do {
            if (0 < n) {
              iVar6 = 0;
              do {
                uVar4 = ((long)local_98.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_98.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
                if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar5);
                  goto LAB_0011166a;
                }
                Wavegeneral_v(local_98.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                              .super__Vector_impl_data._M_start + uVar5 * 0x60,iVar6,n_00,-1,
                              local_80,local_78,fsize);
                iVar6 = iVar6 + 1;
              } while (n != iVar6);
            }
            if (0 < n_00) {
              iVar6 = 0;
              do {
                uVar4 = ((long)local_98.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_98.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
                if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
LAB_0011166a:
                  uVar3 = std::__throw_out_of_range_fmt
                                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                     ,uVar5);
                  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_98);
                  _Unwind_Resume(uVar3);
                }
                Wavegeneral_h(local_98.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl
                              .super__Vector_impl_data._M_start + uVar5 * 0x60,iVar6,n,-1,local_80,
                              local_78,fsize);
                iVar6 = iVar6 + 1;
              } while (n_00 != iVar6);
            }
            uVar5 = uVar5 + 1;
            uVar4 = ((long)local_98.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_98.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                           super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
          } while (uVar5 <= uVar4 && uVar4 - uVar5 != 0);
        }
        n = n * 2;
      } while ((n <= iVar2) && (n_00 = n_00 * 2, n_00 <= iVar1));
    }
    local_48.sz.width = 0;
    local_48.sz.height = 0;
    local_48.flags = 0x1050000;
    local_48.obj = &local_98;
    local_60.super__InputArray.sz.width = 0;
    local_60.super__InputArray.sz.height = 0;
    local_60.super__InputArray.flags = 0x2010000;
    local_60.super__InputArray.obj = local_70;
    cv::merge(&local_48,&local_60);
  }
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_98);
  return;
}

Assistant:

void lts2::InverseWaveletTransform2D(const cv::Mat& src, cv::Mat& dest, double *P, double *Q, int fsize, int *ww, int *wh)
{
  if (!src.data) {
    std::cerr << "InverseWaveletTransform2D() src == NULL" << std::endl;
    return;
  }
	
  cv::Size imageSize = src.size();
    
  dest.create(imageSize, src.type());
	
//	int width = imageSize.width; //XBDW(src)-XBUP(src);
//	int height = imageSize.height; //YBDW(src)-YBUP(src);
	
  std::vector<cv::Mat> components;
  cv::split(src, components);
	
  int width = *ww; 
  int height = *wh;
	
  if (width == 0 || height == 0)
    return;
    
  while(width <= imageSize.width && height <= imageSize.height) 
  {
    for(int b = 0; b < components.size(); ++b) 
    {  
      for(int k = 0; k < width; ++k)
        Wavegeneral_v(components.at(b), k, height, -1, P, Q, fsize);
      for(int k = 0; k < height; ++k)
        Wavegeneral_h(components.at(b), k, width, -1, P, Q, fsize);
    }
    width *= 2;
    height *= 2;
  }
    
  cv::merge(components, dest);
}